

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathNodeSetFilter
               (xmlXPathParserContextPtr ctxt,xmlNodeSetPtr set,int filterOpIndex,int minPos,
               int maxPos,int hasNsNodes)

{
  ulong uVar1;
  xmlXPathContextPtr pxVar2;
  xmlXPathStepOp *pxVar3;
  xmlNodePtr pxVar4;
  xmlDocPtr pxVar5;
  xmlNodePtr pxVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  xmlNodePtr *ppxVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  
  iVar11 = set->nodeNr;
  if (iVar11 != 0) {
    if (iVar11 < minPos) {
      xmlXPathNodeSetClearFromPos(set,0,hasNsNodes);
      return;
    }
    pxVar2 = ctxt->context;
    pxVar5 = pxVar2->doc;
    pxVar6 = pxVar2->node;
    iVar7 = pxVar2->contextSize;
    iVar8 = pxVar2->proximityPosition;
    pxVar3 = ctxt->comp->steps;
    pxVar2->contextSize = iVar11;
    if (iVar11 < 1) {
      uVar14 = 0;
      uVar12 = 0;
    }
    else {
      iVar11 = 1;
      uVar14 = 0;
      uVar13 = 0;
      do {
        pxVar4 = set->nodeTab[uVar13];
        pxVar2->node = pxVar4;
        uVar1 = uVar13 + 1;
        pxVar2->proximityPosition = (int)uVar1;
        if ((pxVar4->type != XML_NAMESPACE_DECL) && (pxVar4->doc != (_xmlDoc *)0x0)) {
          pxVar2->doc = pxVar4->doc;
        }
        iVar9 = xmlXPathCompOpEvalToBoolean(ctxt,pxVar3 + filterOpIndex,1);
        if (ctxt->error != 0) goto LAB_001e2c4e;
        if (iVar9 < 0) {
          xmlXPathErr(ctxt,7);
          goto LAB_001e2c4e;
        }
        if (((iVar9 == 0) || (iVar11 < minPos)) || (maxPos < iVar11)) {
          set->nodeTab[uVar13] = (xmlNodePtr)0x0;
          if (pxVar4->type == XML_NAMESPACE_DECL) {
            xmlXPathNodeSetFreeNs((xmlNsPtr)pxVar4);
          }
          if (iVar9 != 0) goto LAB_001e2c0e;
        }
        else {
          if (uVar13 != uVar14) {
            set->nodeTab[(int)uVar14] = pxVar4;
            set->nodeTab[uVar13] = (xmlNodePtr)0x0;
          }
          uVar14 = uVar14 + 1;
LAB_001e2c0e:
          if (iVar11 == maxPos) {
            uVar13 = (ulong)((int)uVar13 + 1);
            goto LAB_001e2c4e;
          }
          iVar11 = iVar11 + 1;
        }
        uVar13 = uVar1;
      } while ((long)uVar1 < (long)set->nodeNr);
      uVar13 = uVar1 & 0xffffffff;
LAB_001e2c4e:
      uVar12 = (uint)uVar13;
    }
    if ((hasNsNodes != 0) && (iVar11 = set->nodeNr, (int)uVar12 < iVar11)) {
      uVar13 = (ulong)uVar12;
      do {
        pxVar4 = set->nodeTab[uVar13];
        if ((pxVar4 != (xmlNodePtr)0x0) && (pxVar4->type == XML_NAMESPACE_DECL)) {
          xmlXPathNodeSetFreeNs((xmlNsPtr)pxVar4);
          iVar11 = set->nodeNr;
        }
        uVar13 = uVar13 + 1;
      } while ((long)uVar13 < (long)iVar11);
    }
    set->nodeNr = uVar14;
    if ((10 < set->nodeMax) && ((int)uVar14 < (int)((uint)set->nodeMax >> 1))) {
      uVar13 = 10;
      if (10 < (int)uVar14) {
        uVar13 = (ulong)uVar14;
      }
      ppxVar10 = (xmlNodePtr *)(*xmlRealloc)(set->nodeTab,uVar13 * 8);
      if (ppxVar10 == (xmlNodePtr *)0x0) {
        ctxt->error = 0xf;
        xmlXPathErrMemory(ctxt->context,"shrinking nodeset\n");
      }
      else {
        set->nodeTab = ppxVar10;
        set->nodeMax = (int)uVar13;
      }
    }
    pxVar2->doc = pxVar5;
    pxVar2->node = pxVar6;
    pxVar2->contextSize = iVar7;
    pxVar2->proximityPosition = iVar8;
  }
  return;
}

Assistant:

static void
xmlXPathNodeSetFilter(xmlXPathParserContextPtr ctxt,
		      xmlNodeSetPtr set,
		      int filterOpIndex,
                      int minPos, int maxPos,
		      int hasNsNodes)
{
    xmlXPathContextPtr xpctxt;
    xmlNodePtr oldnode;
    xmlDocPtr olddoc;
    xmlXPathStepOpPtr filterOp;
    int oldcs, oldpp;
    int i, j, pos;

    if ((set == NULL) || (set->nodeNr == 0))
        return;

    /*
    * Check if the node set contains a sufficient number of nodes for
    * the requested range.
    */
    if (set->nodeNr < minPos) {
        xmlXPathNodeSetClear(set, hasNsNodes);
        return;
    }

    xpctxt = ctxt->context;
    oldnode = xpctxt->node;
    olddoc = xpctxt->doc;
    oldcs = xpctxt->contextSize;
    oldpp = xpctxt->proximityPosition;
    filterOp = &ctxt->comp->steps[filterOpIndex];

    xpctxt->contextSize = set->nodeNr;

    for (i = 0, j = 0, pos = 1; i < set->nodeNr; i++) {
        xmlNodePtr node = set->nodeTab[i];
        int res;

        xpctxt->node = node;
        xpctxt->proximityPosition = i + 1;

        /*
        * Also set the xpath document in case things like
        * key() are evaluated in the predicate.
        *
        * TODO: Get real doc for namespace nodes.
        */
        if ((node->type != XML_NAMESPACE_DECL) &&
            (node->doc != NULL))
            xpctxt->doc = node->doc;

        res = xmlXPathCompOpEvalToBoolean(ctxt, filterOp, 1);

        if (ctxt->error != XPATH_EXPRESSION_OK)
            break;
        if (res < 0) {
            /* Shouldn't happen */
            xmlXPathErr(ctxt, XPATH_EXPR_ERROR);
            break;
        }

        if ((res != 0) && ((pos >= minPos) && (pos <= maxPos))) {
            if (i != j) {
                set->nodeTab[j] = node;
                set->nodeTab[i] = NULL;
            }

            j += 1;
        } else {
            /* Remove the entry from the initial node set. */
            set->nodeTab[i] = NULL;
            if (node->type == XML_NAMESPACE_DECL)
                xmlXPathNodeSetFreeNs((xmlNsPtr) node);
        }

        if (res != 0) {
            if (pos == maxPos) {
                i += 1;
                break;
            }

            pos += 1;
        }
    }

    /* Free remaining nodes. */
    if (hasNsNodes) {
        for (; i < set->nodeNr; i++) {
            xmlNodePtr node = set->nodeTab[i];
            if ((node != NULL) && (node->type == XML_NAMESPACE_DECL))
                xmlXPathNodeSetFreeNs((xmlNsPtr) node);
        }
    }

    set->nodeNr = j;

    /* If too many elements were removed, shrink table to preserve memory. */
    if ((set->nodeMax > XML_NODESET_DEFAULT) &&
        (set->nodeNr < set->nodeMax / 2)) {
        xmlNodePtr *tmp;
        int nodeMax = set->nodeNr;

        if (nodeMax < XML_NODESET_DEFAULT)
            nodeMax = XML_NODESET_DEFAULT;
        tmp = (xmlNodePtr *) xmlRealloc(set->nodeTab,
                nodeMax * sizeof(xmlNodePtr));
        if (tmp == NULL) {
            xmlXPathPErrMemory(ctxt, "shrinking nodeset\n");
        } else {
            set->nodeTab = tmp;
            set->nodeMax = nodeMax;
        }
    }

    xpctxt->node = oldnode;
    xpctxt->doc = olddoc;
    xpctxt->contextSize = oldcs;
    xpctxt->proximityPosition = oldpp;
}